

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fStencilTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::StencilCase::visualizeStencil
          (StencilCase *this,Context *context,int stencilBits,int stencilStep)

{
  deUint32 program;
  int iVar1;
  int iVar2;
  float fVar3;
  Vector<float,_3> local_5c;
  Vector<float,_3> local_50;
  undefined1 local_44 [8];
  Vec4 color;
  float colorMix;
  int value;
  int ndx;
  int numStencilValues;
  int endVal;
  int stencilStep_local;
  int stencilBits_local;
  Context *context_local;
  StencilCase *this_local;
  
  iVar1 = 1 << ((byte)stencilBits & 0x1f);
  (*context->_vptr_Context[0x33])(context,0xb90,(long)iVar1 % (long)stencilStep & 0xffffffff);
  (*context->_vptr_Context[0x36])(context,0x1e00,0x1e00);
  for (colorMix = 0.0; (int)colorMix < iVar1 / stencilStep + 1;
      colorMix = (float)((int)colorMix + 1)) {
    color.m_data[3] = (float)::deMin32((int)colorMix * stencilStep,iVar1 + -1);
    fVar3 = (float)(int)color.m_data[3];
    iVar2 = de::max<int>(1,iVar1 + -1);
    color.m_data[2] = fVar3 / (float)iVar2;
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)local_44,0.0,1.0 - color.m_data[2],color.m_data[2],1.0);
    StencilShader::setColor(&this->m_shader,context,this->m_shaderID,(Vec4 *)local_44);
    (*context->_vptr_Context[0x35])(context,0x202,(ulong)(uint)color.m_data[3],0xffffffff);
    program = this->m_shaderID;
    tcu::Vector<float,_3>::Vector(&local_50,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_5c,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_50,&local_5c);
  }
  return;
}

Assistant:

void StencilCase::visualizeStencil (sglr::Context& context, int stencilBits, int stencilStep)
{
	int endVal				= 1<<stencilBits;
	int numStencilValues	= endVal/stencilStep + 1;

	context.enable(GL_STENCIL_TEST);
	context.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);

	for (int ndx = 0; ndx < numStencilValues; ndx++)
	{
		int			value		= deMin32(ndx*stencilStep, endVal-1);
		float		colorMix	= (float)value/(float)de::max(1, endVal-1);
		tcu::Vec4	color		(0.0f, 1.0f-colorMix, colorMix, 1.0f);

		m_shader.setColor(context, m_shaderID, color);
		context.stencilFunc(GL_EQUAL, value, 0xffffffffu);
		sglr::drawQuad(context, m_shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
	}
}